

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_augment(lyout *out,lys_node_augment *aug,uint8_t aug_size,int *first)

{
  char *pcVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int f;
  int i;
  int *first_local;
  lys_node_augment *plStack_18;
  uint8_t aug_size_local;
  lys_node_augment *aug_local;
  lyout *out_local;
  
  if (aug_size != '\0') {
    bVar2 = false;
    if (first != (int *)0x0) {
      bVar2 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar2) {
      pcVar1 = "";
    }
    _f = first;
    first_local._7_1_ = aug_size;
    plStack_18 = aug;
    aug_local = (lys_node_augment *)out;
    ly_print(out,"%s\"augment\":{",pcVar1);
    for (local_2c = 0; local_2c < (int)(uint)first_local._7_1_; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      ly_print((lyout *)aug_local,"%s\"%s\":{",pcVar1,plStack_18[local_2c].target_name);
      local_30 = 1;
      jsons_print_text((lyout *)aug_local,"description","text",plStack_18[local_2c].dsc,1,&local_30)
      ;
      jsons_print_text((lyout *)aug_local,"reference","text",plStack_18[local_2c].ref,1,&local_30);
      jsons_print_status((lyout *)aug_local,plStack_18[local_2c].flags,&local_30);
      jsons_print_iffeatures
                ((lyout *)aug_local,plStack_18[local_2c].module,plStack_18[local_2c].iffeature,
                 plStack_18[local_2c].iffeature_size,&local_30);
      jsons_print_when((lyout *)aug_local,plStack_18[local_2c].when,&local_30);
      jsons_print_data((lyout *)aug_local,plStack_18->module,plStack_18->child,&local_30);
      jsons_print_actions((lyout *)aug_local,plStack_18->child,&local_30);
      jsons_print_notifs((lyout *)aug_local,plStack_18->child,&local_30);
      ly_print((lyout *)aug_local,"}");
    }
    ly_print((lyout *)aug_local,"}");
    if (_f != (int *)0x0) {
      *_f = 0;
      ly_print((lyout *)aug_local,"\n");
    }
  }
  return;
}

Assistant:

static void
jsons_print_augment(struct lyout *out, const struct lys_node_augment *aug, uint8_t aug_size, int *first)
{
    int i, f;

    if (!aug_size) {
        return;
    }

    ly_print(out, "%s\"augment\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < aug_size; ++i) {
        ly_print(out, "%s\"%s\":{", i ? "," : "", aug[i].target_name);
        f = 1;
        jsons_print_text(out, "description", "text", aug[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", aug[i].ref, 1, &f);
        jsons_print_status(out, aug[i].flags, &f);
        jsons_print_iffeatures(out, aug[i].module, aug[i].iffeature, aug[i].iffeature_size, &f);
        jsons_print_when(out, aug[i].when, &f);
        jsons_print_data(out, aug->module, aug->child, &f);
        jsons_print_actions(out, aug->child, &f);
        jsons_print_notifs(out, aug->child, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }

    if (first) {
        ly_print(out, "\n");
    }
}